

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O2

tuple<int,_int>
check_paths_and_choose_tuple
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *mtrx)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  pointer pdVar5;
  mapped_type *pmVar6;
  long lVar7;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  const_iterator cVar8;
  pointer pdVar9;
  pointer pvVar10;
  int k;
  ulong uVar11;
  int j;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  vector<double,_std::allocator<double>_> vec2;
  vector<double,_std::allocator<double>_> vec1;
  pair<int,_int> pair;
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> path;
  map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  tmp;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tmp._M_t._M_impl.super__Rb_tree_header._M_header;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tmp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  path.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  path.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  path.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (mtrx->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pvVar10 = (in_RSI->
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pdVar5 = (pointer)0x0;
  pdVar9 = (pointer)0x0;
  uVar11 = 0;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    uVar13 = uVar11;
    if ((ulong)(((long)(in_RSI->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10) / 0x18) <=
        uVar13) {
      findMaxValue_in_map((map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                           *)&pair);
      (mtrx->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)pair;
      reduce_rows_cols(&local_48,in_RSI,(tuple<int,_int> *)mtrx);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_48);
      std::_Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::~_Vector_base
                (&path.
                  super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>);
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
      ::~_Rb_tree(&tmp._M_t);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&vec2.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&vec1.super__Vector_base<double,_std::allocator<double>_>);
      return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)mtrx;
    }
    uVar12 = 0;
    while( true ) {
      lVar7 = *(long *)&pvVar10[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      pdVar3 = *(pointer *)
                ((long)&pvVar10[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + 8);
      uVar11 = uVar13 + 1;
      if ((ulong)((long)pdVar3 - lVar7 >> 3) <= uVar12) break;
      dVar1 = *(double *)(lVar7 + uVar12 * 8);
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        lVar14 = 0;
        for (uVar11 = 0; uVar11 < (ulong)((long)pdVar3 - lVar7 >> 3); uVar11 = uVar11 + 1) {
          std::vector<double,_std::allocator<double>_>::push_back
                    (&vec1,(value_type *)(lVar7 + lVar14));
          pvVar10 = (in_RSI->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar7 = *(long *)&pvVar10[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data;
          pdVar3 = *(pointer *)
                    ((long)&pvVar10[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8);
          lVar14 = lVar14 + 8;
        }
        pdVar5 = vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar12 + 1;
        if (pdVar5 != vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          memmove(vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar12,pdVar5,
                  (long)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar5);
        }
        vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        lVar7 = (long)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
        pdVar5 = vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar14 = lVar7 >> 5; 0 < lVar14; lVar14 = lVar14 + -1) {
          if (NAN(*pdVar5)) goto LAB_0010275f;
          if (NAN(pdVar5[1])) {
            pdVar5 = pdVar5 + 1;
            goto LAB_0010275f;
          }
          if (NAN(pdVar5[2])) {
            pdVar5 = pdVar5 + 2;
            goto LAB_0010275f;
          }
          if (NAN(pdVar5[3])) {
            pdVar5 = pdVar5 + 3;
            goto LAB_0010275f;
          }
          pdVar5 = pdVar5 + 4;
          lVar7 = lVar7 + -0x20;
        }
        lVar7 = lVar7 >> 3;
        cVar8._M_current =
             vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (lVar7 == 1) {
LAB_00102740:
          if (NAN(*pdVar5)) goto LAB_0010275f;
        }
        else {
          if (lVar7 == 2) {
LAB_00102732:
            if (!NAN(*pdVar5)) {
              pdVar5 = pdVar5 + 1;
              goto LAB_00102740;
            }
          }
          else {
            if (lVar7 != 3) goto LAB_0010278f;
            if (!NAN(*pdVar5)) {
              pdVar5 = pdVar5 + 1;
              goto LAB_00102732;
            }
          }
LAB_0010275f:
          cVar8._M_current = pdVar5;
          if (pdVar5 != vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
            while (pdVar5 = pdVar5 + 1,
                  pdVar5 != vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish) {
              if (!NAN(*pdVar5)) {
                *cVar8._M_current = *pdVar5;
                cVar8._M_current = cVar8._M_current + 1;
              }
            }
          }
        }
LAB_0010278f:
        std::vector<double,_std::allocator<double>_>::erase
                  (&vec1,cVar8,
                   (const_iterator)
                   vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        _Var4 = std::
                __min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish);
        dVar1 = *_Var4._M_current;
        lVar7 = 0;
        for (uVar11 = 0;
            pvVar10 = (in_RSI->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
            uVar11 < (ulong)(((long)(in_RSI->
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10) /
                            0x18); uVar11 = uVar11 + 1) {
          std::vector<double,_std::allocator<double>_>::push_back
                    (&vec2,(value_type *)
                           (uVar12 * 8 +
                           *(long *)((long)&(pvVar10->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data + lVar7)));
          lVar7 = lVar7 + 0x18;
        }
        pdVar5 = vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar13 + 1;
        if (pdVar5 != vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          memmove(vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar13,pdVar5,
                  (long)vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar5);
        }
        vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        lVar7 = (long)vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
        pdVar5 = vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar14 = lVar7 >> 5; 0 < lVar14; lVar14 = lVar14 + -1) {
          if (NAN(*pdVar5)) goto LAB_001028c4;
          if (NAN(pdVar5[1])) {
            pdVar5 = pdVar5 + 1;
            goto LAB_001028c4;
          }
          if (NAN(pdVar5[2])) {
            pdVar5 = pdVar5 + 2;
            goto LAB_001028c4;
          }
          if (NAN(pdVar5[3])) {
            pdVar5 = pdVar5 + 3;
            goto LAB_001028c4;
          }
          pdVar5 = pdVar5 + 4;
          lVar7 = lVar7 + -0x20;
        }
        lVar7 = lVar7 >> 3;
        cVar8._M_current =
             vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (lVar7 == 1) {
LAB_001028a5:
          if (NAN(*pdVar5)) goto LAB_001028c4;
        }
        else {
          if (lVar7 == 2) {
LAB_00102897:
            if (!NAN(*pdVar5)) {
              pdVar5 = pdVar5 + 1;
              goto LAB_001028a5;
            }
          }
          else {
            if (lVar7 != 3) goto LAB_001028f4;
            if (!NAN(*pdVar5)) {
              pdVar5 = pdVar5 + 1;
              goto LAB_00102897;
            }
          }
LAB_001028c4:
          cVar8._M_current = pdVar5;
          if (pdVar5 != vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
            while (pdVar5 = pdVar5 + 1,
                  pdVar5 != vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish) {
              if (!NAN(*pdVar5)) {
                *cVar8._M_current = *pdVar5;
                cVar8._M_current = cVar8._M_current + 1;
              }
            }
          }
        }
LAB_001028f4:
        std::vector<double,_std::allocator<double>_>::erase
                  (&vec2,cVar8,
                   (const_iterator)
                   vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        _Var4 = std::
                __min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish);
        dVar2 = *_Var4._M_current;
        pair = (pair<int,_int>)((uVar12 << 0x20) + uVar13 + 1 + 0x100000000);
        pmVar6 = std::
                 map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                 ::operator[](&tmp,&pair);
        *pmVar6 = dVar1 + dVar2;
        pdVar5 = vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pdVar9 = vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      if (pdVar5 != pdVar9) {
        pdVar5 = pdVar9;
        vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = pdVar9;
      }
      if (vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      uVar12 = uVar12 + 1;
      pvVar10 = (in_RSI->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
  } while( true );
}

Assistant:

std::tuple<int,int> check_paths_and_choose_tuple(std::vector<std::vector<double>> &mtrx){

    std::vector<double> vec1,vec2;
    std::map<std::pair<int,int>,double> tmp;
    std::vector<std::tuple<int,int>> path;
    std::tuple<int,int> pas;

    double buff1,buff2;
    for (int i=0; i<mtrx.size();i++){
        for(int j=0; j<mtrx[i].size();j++) {
            if (mtrx[i][j] == 0) {
                for (int k = 0; k < mtrx[i].size(); k++) {
                    vec1.push_back(mtrx[i][k]);
                }
                vec1.erase(vec1.begin() + j);
                vec1.erase(std::remove_if(std::begin(vec1),std::end(vec1), [](const auto& value) {return std::isnan(value);}),std::end(vec1));
                buff1 = *std::min_element(vec1.begin(),vec1.end());
                for(int l =0; l<mtrx.size(); l++){
                    vec2.push_back(mtrx[l][j]);
                }
                vec2.erase(vec2.begin()+ i);
                vec2.erase(std::remove_if(std::begin(vec2),std::end(vec2), [](const auto& value) {return std::isnan(value);}),std::end(vec2));
                buff2 = *std::min_element(vec2.begin(),vec2.end());
                auto pair = std::make_pair(i+1,j+1);
                tmp[pair] = buff1+buff2;
            }
            vec1.clear();
            vec2.clear();
        }
    }


    pas = findMaxValue_in_map(tmp);
    reduce_rows_cols(mtrx,pas);


    return pas;
}